

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O2

bool wallet::coinselector_tests::EqualResult(SelectionResult *a,SelectionResult *b)

{
  long lVar1;
  bool bVar2;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  _Rb_tree_node_base *p_Var7;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  psVar3 = SelectionResult::GetInputSet(a);
  p_Var4 = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  psVar3 = SelectionResult::GetInputSet(a);
  p_Var6 = &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
  psVar3 = SelectionResult::GetInputSet(b);
  p_Var5 = (psVar3->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((p_Var7 = &p_Var6->_M_header, (_Rb_tree_header *)p_Var4 != p_Var6 &&
         (bVar2 = ::operator==((COutPoint *)(*(long *)(p_Var4 + 1) + 0x20),
                               (COutPoint *)(*(long *)(p_Var5 + 1) + 0x20)), p_Var7 = p_Var4, bVar2)
         )) {
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  }
  psVar3 = SelectionResult::GetInputSet(a);
  if ((_Rb_tree_header *)p_Var7 == &(psVar3->_M_t)._M_impl.super__Rb_tree_header) {
    psVar3 = SelectionResult::GetInputSet(b);
    bVar2 = (_Rb_tree_header *)p_Var5 == &(psVar3->_M_t)._M_impl.super__Rb_tree_header;
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

static bool EqualResult(const SelectionResult& a, const SelectionResult& b)
{
    std::pair<CoinSet::iterator, CoinSet::iterator> ret = std::mismatch(a.GetInputSet().begin(), a.GetInputSet().end(), b.GetInputSet().begin(),
        [](const std::shared_ptr<COutput>& a, const std::shared_ptr<COutput>& b) {
            return a->outpoint == b->outpoint;
        });
    return ret.first == a.GetInputSet().end() && ret.second == b.GetInputSet().end();
}